

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  mapped_type mVar1;
  bool bVar2;
  size_type sVar3;
  reference puVar4;
  pointer pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  pointer ppVar10;
  FaceIter *pFVar11;
  VertexIter *pVVar12;
  VertexIter *pVVar13;
  pointer pEVar14;
  EdgeIter *pEVar15;
  reference pvVar16;
  HalfedgeIter *pHVar17;
  HalfedgeIter *pHVar18;
  pointer pHVar19;
  pointer pFVar20;
  mapped_type *pmVar21;
  size_type sVar22;
  size_type sVar23;
  ostream *poVar24;
  const_reference this_00;
  pointer pVVar25;
  pointer pVVar26;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_RDX;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RSI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar27;
  VertexIter v_4;
  const_iterator e_2;
  int i;
  HalfedgeIter h_2;
  Size count;
  VertexIter v_3;
  VertexIter v_2;
  Index q;
  Index p_2;
  Size degree_2;
  EdgeIter e_1;
  HalfedgeIter t;
  HalfedgeIter i_5;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  boundaryHalfedges;
  FaceIter b_1;
  HalfedgeIter h_1;
  HalfedgeIter h;
  VertexIter v_1;
  Index j;
  Index i_4;
  EdgeIter e;
  HalfedgeIter hba;
  iterator iba;
  IndexPair ba;
  HalfedgeIter hab;
  IndexPair ab;
  Index b;
  Index a;
  Index i_3;
  Size degree_1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  faceHalfedges;
  FaceIter f;
  PolygonListCIter p;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  Size nFaces;
  Size nVertices;
  IndexListCIter i_2;
  Size degree;
  VertexIter v;
  IndexListCIter i_1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> polygonIndices;
  PolygonListCIter p_1;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  HalfedgeMesh *in_stack_fffffffffffff938;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *in_stack_fffffffffffff940;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffff948;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *in_stack_fffffffffffff950;
  value_type_conflict *in_stack_fffffffffffff958;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffff960;
  size_type in_stack_fffffffffffff968;
  list<CMU462::Face,_std::allocator<CMU462::Face>_> *in_stack_fffffffffffff970;
  key_type *in_stack_fffffffffffff978;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  *in_stack_fffffffffffff980;
  HalfedgeMesh *in_stack_fffffffffffff9a8;
  HalfedgeMesh *in_stack_fffffffffffff9d8;
  HalfedgeMesh *in_stack_fffffffffffffa28;
  bool local_5a1;
  HalfedgeMesh *in_stack_fffffffffffffa78;
  iterator local_370;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
  local_368;
  iterator local_360;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
  local_358;
  int local_34c;
  _List_node_base *local_348;
  _Self local_340;
  mapped_type local_338;
  _Self local_330;
  _Self local_328;
  _Self local_320;
  _List_node_base *local_318;
  _Self local_310;
  _Self local_308;
  _List_node_base *local_300;
  ulong local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  _Self local_2e0;
  _List_node_base *local_2d8;
  _List_node_base *local_2d0;
  _Self local_2c8;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_2c0;
  _List_node_base *local_2a8;
  _Self local_2a0;
  _Self local_298;
  _Self local_290;
  _List_node_base *local_288;
  _Self local_280;
  _Self local_278;
  _Self local_270;
  _Self local_268;
  _List_node_base *local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_258;
  ulong local_250;
  ulong local_248;
  _List_node_base *local_240;
  _List_node_base *local_238;
  _List_node_base *local_230;
  _Self local_228;
  _Self local_220;
  pair<unsigned_long,_unsigned_long> local_218;
  _List_node_base *local_208;
  _Self local_200;
  _Self local_1f8;
  _List_iterator<CMU462::Halfedge> local_1f0;
  pair<unsigned_long,_unsigned_long> local_1e8;
  value_type local_1d8;
  value_type local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  _List_node_base *local_198;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_190;
  _List_iterator<CMU462::Face> local_188;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_180 [7];
  size_type local_148;
  size_type local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_138;
  unsigned_long *local_130;
  unsigned_long *local_128;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120;
  ulong local_118;
  unsigned_long *local_110;
  _List_node_base *local_108;
  _List_node_base *local_100;
  _Self local_f8;
  _Self local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0;
  unsigned_long *local_d8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0 [9];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_80 [13];
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_18;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear
            ((list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)in_stack_fffffffffffff940)
  ;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear
            ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)in_stack_fffffffffffff940);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(in_stack_fffffffffffff940);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffff940);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffff940);
  std::
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::map((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
         *)0x22e5e5);
  std::
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  ::map((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
         *)0x22e5f2);
  local_80[0]._M_current =
       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
       std::
       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)in_stack_fffffffffffff938);
  while( true ) {
    local_88 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)in_stack_fffffffffffff938);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff940,
                       (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff938);
    if (!bVar2) break;
    pvVar5 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_80);
    sVar22 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    if (sVar22 < 3) {
      poVar24 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                               );
      std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x22e6b8);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator->(local_80);
    local_d0[0]._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff938);
    while( true ) {
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator->(local_80);
      local_d8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_fffffffffffff938);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff940,
                         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffff938);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_d0);
      pVar27 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      local_e8 = (_Base_ptr)pVar27.first._M_node;
      local_e0 = pVar27.second;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_d0);
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
           ::find((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                   *)in_stack_fffffffffffff938,(key_type_conflict1 *)0x22e779);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
           ::end((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  *)in_stack_fffffffffffff938);
      bVar2 = std::operator==(&local_f0,&local_f8);
      if (bVar2) {
        local_100 = (_List_node_base *)newVertex(in_stack_fffffffffffffa78);
        local_108 = (_List_node_base *)
                    std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                              (&in_stack_fffffffffffff938->halfedges);
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        pHVar18 = Vertex::halfedge(pVVar25);
        pHVar18->_M_node = local_108;
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_d0);
        pmVar9 = std::
                 map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                 ::operator[](in_stack_fffffffffffff980,&in_stack_fffffffffffff978->first);
        pmVar9->_M_node = local_100;
        pmVar21 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff980,(key_type *)in_stack_fffffffffffff978);
        *pmVar21 = 1;
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_d0);
        std::
        map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
        ::operator[](in_stack_fffffffffffff980,&in_stack_fffffffffffff978->first);
        pmVar21 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff980,(key_type *)in_stack_fffffffffffff978);
        *pmVar21 = *pmVar21 + 1;
      }
      local_110 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffff948,
                               (int)((ulong)in_stack_fffffffffffff940 >> 0x20));
    }
    pvVar5 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_80);
    local_118 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x22e964);
    if (sVar3 < local_118) {
      poVar24 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                               );
      std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cerr,"(vertex indices:");
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator->(local_80);
      local_120._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffff938);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::operator->(local_80);
        local_128 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff938);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff940,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff938);
        if (!bVar2) break;
        poVar24 = std::operator<<((ostream *)&std::cerr," ");
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_120);
        std::ostream::operator<<(poVar24,*puVar4);
        local_130 = (unsigned_long *)
                    __gnu_cxx::
                    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffff948,
                                 (int)((ulong)in_stack_fffffffffffff940 >> 0x20));
      }
      poVar24 = std::operator<<((ostream *)&std::cerr,")");
      std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               0x22eab3);
    local_138 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator++(in_stack_fffffffffffff948,
                             (int)((ulong)in_stack_fffffffffffff940 >> 0x20));
  }
  local_140 = std::
              map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
              ::size((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                      *)0x22eadc);
  local_148 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(local_10);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  std::
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
         *)0x22eb21);
  __gnu_cxx::
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::__normal_iterator(local_180);
  std::_List_iterator<CMU462::Face>::_List_iterator(&local_188);
  local_190 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffff938);
  local_180[0]._M_current = local_190;
  local_198 = (_List_node_base *)
              std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::begin
                        ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)
                         in_stack_fffffffffffff938);
  local_188._M_node = local_198;
  while( true ) {
    local_1a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffff938);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff940,
                       (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)in_stack_fffffffffffff938);
    if (!bVar2) break;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)0x22ebc9);
    pvVar5 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator->(local_180);
    local_1c0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar5);
    for (local_1c8 = 0; local_1c8 < local_1c0; local_1c8 = local_1c8 + 1) {
      pvVar6 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(local_180);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,local_1c8);
      local_1d0 = *pvVar7;
      pvVar6 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*(local_180);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar6,(local_1c8 + 1) % local_1c0);
      local_1d8 = *pvVar7;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_1e8,&local_1d0,&local_1d8);
      std::_List_iterator<CMU462::Halfedge>::_List_iterator(&local_1f0);
      local_1f8._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   *)in_stack_fffffffffffff938,(key_type *)0x22ecb4);
      local_200._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  *)in_stack_fffffffffffff938);
      bVar2 = std::operator!=(&local_1f8,&local_200);
      if (bVar2) {
        poVar24 = std::operator<<((ostream *)&std::cerr,
                                  "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                                 );
        poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1d0);
        poVar24 = std::operator<<(poVar24,", ");
        poVar24 = (ostream *)std::ostream::operator<<(poVar24,local_1d8);
        poVar24 = std::operator<<(poVar24,").");
        std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
        poVar24 = std::operator<<((ostream *)&std::cerr,
                                  "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                                 );
        std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
        poVar24 = std::operator<<((ostream *)&std::cerr,
                                  "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                                 );
        std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
        poVar24 = std::operator<<((ostream *)&std::cerr,"not consistently oriented.");
        std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      local_208 = (_List_node_base *)newHalfedge(in_stack_fffffffffffff9a8);
      local_1f0._M_node = local_208;
      pmVar8 = std::
               map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      pmVar8->_M_node = local_1f0._M_node;
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      pFVar11 = Halfedge::face(pHVar19);
      pFVar11->_M_node = local_188._M_node;
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      Halfedge::face(pHVar19);
      pFVar20 = std::_List_iterator<CMU462::Face>::operator->
                          ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffff940);
      pHVar18 = Face::halfedge(pFVar20);
      pHVar18->_M_node = local_1f0._M_node;
      pmVar9 = std::
               map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
               ::operator[](in_stack_fffffffffffff980,&in_stack_fffffffffffff978->first);
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      pVVar12 = Halfedge::vertex(pHVar19);
      pVVar12->_M_node = pmVar9->_M_node;
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      Halfedge::vertex(pHVar19);
      pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                          ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
      pHVar18 = Vertex::halfedge(pVVar25);
      pHVar18->_M_node = local_1f0._M_node;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back(in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_218,&local_1d8,&local_1d0);
      local_220._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   *)in_stack_fffffffffffff938,(key_type *)0x22f055);
      local_228._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  *)in_stack_fffffffffffff938);
      bVar2 = std::operator!=(&local_220,&local_228);
      if (bVar2) {
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>
                                *)0x22f0af);
        local_230 = (ppVar10->second)._M_node;
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pHVar18 = Halfedge::twin(pHVar19);
        pHVar18->_M_node = local_230;
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pHVar18 = Halfedge::twin(pHVar19);
        pHVar18->_M_node = local_1f0._M_node;
        local_238 = (_List_node_base *)newEdge(in_stack_fffffffffffff9d8);
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pEVar15 = Halfedge::edge(pHVar19);
        pEVar15->_M_node = local_238;
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pEVar15 = Halfedge::edge(pHVar19);
        pEVar15->_M_node = local_238;
        pEVar14 = std::_List_iterator<CMU462::Edge>::operator->
                            ((_List_iterator<CMU462::Edge> *)0x22f1b7);
        pHVar18 = Edge::halfedge(pEVar14);
        pHVar18->_M_node = local_1f0._M_node;
      }
      else {
        local_240 = (_List_node_base *)
                    std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                              (&in_stack_fffffffffffff938->halfedges);
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pHVar18 = Halfedge::twin(pHVar19);
        pHVar18->_M_node = local_240;
      }
    }
    for (local_248 = 0; local_248 < local_1c0; local_248 = local_248 + 1) {
      local_250 = (local_248 + 1) % local_1c0;
      pvVar16 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[](&local_1b8,local_250);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::operator[](&local_1b8,local_248);
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      pHVar18 = Halfedge::next(pHVar19);
      pHVar18->_M_node = pvVar16->_M_node;
    }
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~vector(in_stack_fffffffffffff950);
    local_258 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::operator++(in_stack_fffffffffffff948,
                             (int)((ulong)in_stack_fffffffffffff940 >> 0x20));
    local_260 = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_188,0);
  }
  local_268._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffff938);
  do {
    local_270._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffff938);
    bVar2 = std::operator!=(&local_268,&local_270);
    if (!bVar2) {
      local_290._M_node = (_List_node_base *)halfedgesBegin(in_stack_fffffffffffff938);
      while( true ) {
        local_298._M_node = (_List_node_base *)halfedgesEnd(in_stack_fffffffffffff938);
        bVar2 = std::operator!=(&local_290,&local_298);
        if (!bVar2) break;
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pHVar18 = Halfedge::twin(pHVar19);
        local_2a0._M_node =
             (_List_node_base *)
             std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                       (&in_stack_fffffffffffff938->halfedges);
        bVar2 = std::operator==(pHVar18,&local_2a0);
        if (bVar2) {
          local_2a8 = (_List_node_base *)newBoundary(in_stack_fffffffffffffa28);
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    *)0x22f61f);
          local_2c8._M_node = local_290._M_node;
          do {
            local_2d0 = (_List_node_base *)newHalfedge(in_stack_fffffffffffff9a8);
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ::push_back(in_stack_fffffffffffff950,(value_type *)in_stack_fffffffffffff948);
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pHVar18 = Halfedge::twin(pHVar19);
            pHVar18->_M_node = local_2d0;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pHVar18 = Halfedge::twin(pHVar19);
            pHVar18->_M_node = local_2c8._M_node;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pFVar11 = Halfedge::face(pHVar19);
            pFVar11->_M_node = local_2a8;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            Halfedge::next(pHVar19);
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pVVar12 = Halfedge::vertex(pHVar19);
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pVVar13 = Halfedge::vertex(pHVar19);
            pVVar13->_M_node = pVVar12->_M_node;
            local_2d8 = (_List_node_base *)newEdge(in_stack_fffffffffffff9d8);
            pEVar14 = std::_List_iterator<CMU462::Edge>::operator->
                                ((_List_iterator<CMU462::Edge> *)0x22f7aa);
            pHVar18 = Edge::halfedge(pEVar14);
            pHVar18->_M_node = local_2c8._M_node;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pEVar15 = Halfedge::edge(pHVar19);
            pEVar15->_M_node = local_2d8;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pEVar15 = Halfedge::edge(pHVar19);
            pEVar15->_M_node = local_2d8;
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            pHVar18 = Halfedge::next(pHVar19);
            local_2c8._M_node = pHVar18->_M_node;
            while( true ) {
              bVar2 = std::operator!=(&local_2c8,&local_290);
              local_5a1 = false;
              if (bVar2) {
                pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                    ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
                pHVar18 = Halfedge::twin(pHVar19);
                local_2e0._M_node =
                     (_List_node_base *)
                     std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                               (&in_stack_fffffffffffff938->halfedges);
                local_5a1 = std::operator!=(pHVar18,&local_2e0);
              }
              if (local_5a1 == false) break;
              pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                  ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
              pHVar18 = Halfedge::twin(pHVar19);
              local_2c8._M_node = pHVar18->_M_node;
              pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                  ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
              pHVar18 = Halfedge::next(pHVar19);
              local_2c8._M_node = pHVar18->_M_node;
            }
            bVar2 = std::operator!=(&local_2c8,&local_290);
          } while (bVar2);
          pvVar16 = std::
                    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ::front((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                             *)in_stack_fffffffffffff940);
          pFVar20 = std::_List_iterator<CMU462::Face>::operator->
                              ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffff940);
          pHVar18 = Face::halfedge(pFVar20);
          pHVar18->_M_node = pvVar16->_M_node;
          local_2e8 = std::
                      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ::size(&local_2c0);
          for (local_2f0 = 0; local_2f0 < local_2e8; local_2f0 = local_2f0 + 1) {
            local_2f8 = ((local_2f0 - 1) + local_2e8) % local_2e8;
            pvVar16 = std::
                      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ::operator[](&local_2c0,local_2f8);
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ::operator[](&local_2c0,local_2f0);
            pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
            in_stack_fffffffffffffa28 = (HalfedgeMesh *)Halfedge::next(pHVar19);
            (in_stack_fffffffffffffa28->halfedges).
            super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
            super__List_node_base._M_next = pvVar16->_M_node;
          }
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ::~vector(in_stack_fffffffffffff950);
        }
        local_300 = (_List_node_base *)
                    std::_List_iterator<CMU462::Halfedge>::operator++(&local_290,0);
      }
      local_308._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffff938);
      while( true ) {
        local_310._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffff938);
        bVar2 = std::operator!=(&local_308,&local_310);
        if (!bVar2) break;
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        Vertex::halfedge(pVVar25);
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        Halfedge::twin(pHVar19);
        pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
        pHVar18 = Halfedge::next(pHVar19);
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        pHVar17 = Vertex::halfedge(pVVar25);
        pHVar17->_M_node = pHVar18->_M_node;
        local_318 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_308,0)
        ;
      }
      local_320._M_node =
           (_List_node_base *)
           std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::begin
                     ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                      in_stack_fffffffffffff938);
      while( true ) {
        local_328._M_node =
             (_List_node_base *)
             std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end
                       ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                        in_stack_fffffffffffff938);
        bVar2 = std::operator!=(&local_320,&local_328);
        if (!bVar2) {
          sVar22 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size(local_18);
          sVar23 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::size
                             ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                              in_stack_fffffffffffff940);
          if (sVar23 <= sVar22) {
            local_34c = 0;
            local_360._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                 ::begin((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                          *)in_stack_fffffffffffff938);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
            ::_Rb_tree_const_iterator(&local_358,&local_360);
            while( true ) {
              local_370._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                   ::end((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                          *)in_stack_fffffffffffff938);
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
              ::_Rb_tree_const_iterator(&local_368,&local_370);
              bVar2 = std::operator!=(&local_358,&local_368);
              if (!bVar2) break;
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
              ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
                            *)0x230050);
              this_00 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                                  (local_18,(long)local_34c);
              pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                                  ((_List_iterator<CMU462::Vertex> *)this_00);
              (pVVar25->position).x = this_00->x;
              (pVVar25->position).y = this_00->y;
              (pVVar25->position).z = this_00->z;
              pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                                  ((_List_iterator<CMU462::Vertex> *)this_00);
              pVVar26 = std::_List_iterator<CMU462::Vertex>::operator->
                                  ((_List_iterator<CMU462::Vertex> *)this_00);
              (pVVar26->bindPosition).x = (pVVar25->position).x;
              (pVVar26->bindPosition).y = (pVVar25->position).y;
              (pVVar26->bindPosition).z = (pVVar25->position).z;
              local_34c = local_34c + 1;
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
              ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
                            *)pVVar25,(int)((ulong)this_00 >> 0x20));
            }
            std::
            map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
            ::~map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    *)0x230115);
            std::
            map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
            ::~map((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    *)0x230122);
            std::
            map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
            ::~map((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    *)0x23012f);
            return;
          }
          poVar24 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
                                   );
          std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
          poVar24 = std::operator<<((ostream *)&std::cerr,"(number of positions in input: ");
          sVar22 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size(local_18);
          poVar24 = (ostream *)std::ostream::operator<<(poVar24,sVar22);
          poVar24 = std::operator<<(poVar24,")");
          std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
          poVar24 = std::operator<<((ostream *)&std::cerr,"(  number of vertices in mesh: ");
          sVar22 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::size
                             ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                              in_stack_fffffffffffff940);
          poVar24 = (ostream *)std::ostream::operator<<(poVar24,sVar22);
          poVar24 = std::operator<<(poVar24,")");
          std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        pHVar18 = Vertex::halfedge(pVVar25);
        local_330._M_node =
             (_List_node_base *)
             std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                       (&in_stack_fffffffffffff938->halfedges);
        bVar2 = std::operator==(pHVar18,&local_330);
        if (bVar2) break;
        local_338 = 0;
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        pHVar18 = Vertex::halfedge(pVVar25);
        local_340._M_node = pHVar18->_M_node;
        do {
          pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                              ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
          Halfedge::face(pHVar19);
          pFVar20 = std::_List_iterator<CMU462::Face>::operator->
                              ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffff940);
          bVar2 = Face::isBoundary(pFVar20);
          if (!bVar2) {
            local_338 = local_338 + 1;
          }
          pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                              ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
          Halfedge::twin(pHVar19);
          pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                              ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
          pHVar18 = Halfedge::next(pHVar19);
          local_340._M_node = pHVar18->_M_node;
          pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                              ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
          pHVar18 = Vertex::halfedge(pVVar25);
          bVar2 = std::operator!=(&local_340,pHVar18);
          mVar1 = local_338;
        } while (bVar2);
        pmVar21 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff980,(key_type *)in_stack_fffffffffffff978);
        if (mVar1 != *pmVar21) {
          poVar24 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                                   );
          std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        local_348 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_320,0)
        ;
      }
      poVar24 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                               );
      std::ostream::operator<<(poVar24,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                        ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
    pHVar18 = Vertex::halfedge(pVVar25);
    local_278._M_node = pHVar18->_M_node;
    do {
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      pHVar18 = Halfedge::twin(pHVar19);
      local_280._M_node =
           (_List_node_base *)
           std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                     (&in_stack_fffffffffffff938->halfedges);
      bVar2 = std::operator==(pHVar18,&local_280);
      if (bVar2) {
        pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                            ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
        pHVar18 = Vertex::halfedge(pVVar25);
        pHVar18->_M_node = local_278._M_node;
        break;
      }
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      Halfedge::twin(pHVar19);
      pHVar19 = std::_List_iterator<CMU462::Halfedge>::operator->
                          ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffff940);
      pHVar18 = Halfedge::next(pHVar19);
      local_278._M_node = pHVar18->_M_node;
      pVVar25 = std::_List_iterator<CMU462::Vertex>::operator->
                          ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffff940);
      pHVar18 = Vertex::halfedge(pVVar25);
      bVar2 = std::operator!=(&local_278,pHVar18);
    } while (bVar2);
    local_288 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_268,0);
  } while( true );
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
    if (p->size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // constructsomething fairlymeaningful for 1- and 2-point polygons, but
      // enforcing this stricterrequirementon the input will help simplify code
      // further downstream, since it canbe certainit doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (IndexListCIter i = p->begin(); i != p->end(); i++) {
      polygonIndices.insert(*i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(*i) == indexToVertex.end()) {
        VertexIter v = newVertex();
        v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[*i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[*i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = p->size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        cerr << " " << *i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of vertices in the mesh is the
  // number of unique indices seen in the input.
  Size nVertices = indexToVertex.size();

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        HalfedgeIter hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        EdgeIter e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    HalfedgeIter h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
       h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      FaceIter b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      HalfedgeIter i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        HalfedgeIter t = newHalfedge();
        boundaryHalfedges.push_back(
            t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        EdgeIter e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    HalfedgeIter h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    v->bindPosition = v->position;
    i++;
  }

}